

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

void __thiscall mjs::anon_unknown_46::stringify_state::~stringify_state(stringify_state *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  undefined8 *puVar3;
  gc_table *pgVar4;
  
  if ((this->stack_).super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&(this->stack_).super_gc_heap_ptr_untyped);
    pgVar4 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::gc_table,_true>
             ::dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::gc_table,_true>
                            *)(puVar3 + 1),(gc_heap *)*puVar3);
    if (pgVar4->length_ != 0) {
      __assert_fail("!stack_ || stack_->length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x202,"mjs::(anonymous namespace)::stringify_state::~stringify_state()");
    }
  }
  pwVar2 = (this->gap_)._M_dataplus._M_p;
  paVar1 = &(this->gap_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  pwVar2 = (this->indent_)._M_dataplus._M_p;
  paVar1 = &(this->indent_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->property_names_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->replacer_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&(this->stack_).super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  return;
}

Assistant:

~stringify_state() {
        assert(!stack_ || stack_->length() == 0);
    }